

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O2

void __thiscall chrono::utils::ChChaseCamera::Turn(ChChaseCamera *this,int val)

{
  double dVar1;
  
  if (val == 0) {
    return;
  }
  if (1 < this->m_state - Follow) {
    if (this->m_state == Free) {
      if (val < 0) {
        dVar1 = this->m_angle + 0.005235987755982988;
      }
      else {
        dVar1 = this->m_angle + -0.005235987755982988;
      }
    }
    else {
      dVar1 = this->m_angle;
      if (val < 0) {
        if (dVar1 <= -3.141592653589793) {
          return;
        }
        dVar1 = dVar1 + -0.031415926535897934;
      }
      else {
        if (3.141592653589793 <= dVar1) {
          return;
        }
        dVar1 = dVar1 + 0.031415926535897934;
      }
    }
    this->m_angle = dVar1;
    return;
  }
  return;
}

Assistant:

void ChChaseCamera::Turn(int val) {
    if (val == 0 || m_state == Follow || m_state == Track)
        return;

    if (m_state == Free) {
        if (val < 0)
            m_angle += CH_C_PI / 600;
        else
            m_angle -= CH_C_PI / 600;

        return;
    }

    if (val < 0 && m_angle > -CH_C_PI)
        m_angle -= CH_C_PI / 100;
    else if (val > 0 && m_angle < CH_C_PI)
        m_angle += CH_C_PI / 100;
}